

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
anurbs::RTree<3L>::by_box
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,RTree<3L> *this,Vector *box_a
          ,Vector *box_b,Callback *callback)

{
  function<bool_(long)> local_b0;
  Matrix<double,_1,_3,_1,_1,_3> local_90;
  Matrix<double,_1,_3,_1,_1,_3> local_78;
  undefined1 local_60 [8];
  PickByBox check;
  Callback *callback_local;
  Vector *box_b_local;
  Vector *box_a_local;
  RTree<3L> *this_local;
  
  check.m_box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[2] = (double)callback;
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_78,box_a);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_90,box_b);
  PickByBox::PickByBox((PickByBox *)local_60,&local_78,&local_90);
  std::function<bool_(long)>::function(&local_b0,callback);
  RTree<3l>::search<anurbs::RTree<3l>::PickByBox>
            (__return_storage_ptr__,this,(PickByBox *)local_60,&local_b0);
  std::function<bool_(long)>::~function(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> by_box(const Vector box_a, const Vector box_b, Callback callback=nullptr)
    {
        PickByBox check(box_a, box_b);
        return search(check, callback);
    }